

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonEachOpenEach(sqlite3_vtab *p,sqlite3_vtab_cursor **ppCursor)

{
  int iVar1;
  sqlite3_vtab_cursor *psVar2;
  int iVar3;
  
  iVar1 = sqlite3_initialize();
  iVar3 = 7;
  if (iVar1 == 0) {
    psVar2 = (sqlite3_vtab_cursor *)sqlite3Malloc(0x60);
    if (psVar2 != (sqlite3_vtab_cursor *)0x0) {
      psVar2[10].pVtab = (sqlite3_vtab *)0x0;
      psVar2[0xb].pVtab = (sqlite3_vtab *)0x0;
      psVar2[8].pVtab = (sqlite3_vtab *)0x0;
      psVar2[9].pVtab = (sqlite3_vtab *)0x0;
      psVar2[6].pVtab = (sqlite3_vtab *)0x0;
      psVar2[7].pVtab = (sqlite3_vtab *)0x0;
      psVar2[4].pVtab = (sqlite3_vtab *)0x0;
      psVar2[5].pVtab = (sqlite3_vtab *)0x0;
      psVar2[2].pVtab = (sqlite3_vtab *)0x0;
      psVar2[3].pVtab = (sqlite3_vtab *)0x0;
      psVar2->pVtab = (sqlite3_vtab *)0x0;
      psVar2[1].pVtab = (sqlite3_vtab *)0x0;
      *ppCursor = psVar2;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int jsonEachOpenEach(sqlite3_vtab *p, sqlite3_vtab_cursor **ppCursor){
  JsonEachCursor *pCur;

  UNUSED_PARAM(p);
  pCur = sqlite3_malloc( sizeof(*pCur) );
  if( pCur==0 ) return SQLITE_NOMEM;
  memset(pCur, 0, sizeof(*pCur));
  *ppCursor = &pCur->base;
  return SQLITE_OK;
}